

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O1

int32_t ustrcase_internalToUpper_63
                  (int32_t caseLocale,uint32_t options,BreakIterator *param_3,UChar *dest,
                  int32_t destCapacity,UChar *src,int32_t srcLength,Edits *edits,
                  UErrorCode *errorCode)

{
  UChar UVar1;
  ushort uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int32_t result;
  uint destIndex;
  undefined1 *puVar6;
  UTrie2 *pUVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  bool bVar13;
  char cVar14;
  uint local_a0;
  UChar *local_60;
  UCaseContext csc;
  
  uVar10 = (ulong)(uint)destCapacity;
  if (caseLocale == 4) {
    uVar5 = icu_63::GreekUpper::toUpper(options,dest,destCapacity,src,srcLength,edits,errorCode);
  }
  else {
    csc.start = 0;
    csc.index = 0;
    csc.cpLimit = 0;
    csc.dir = '\0';
    csc.b1 = '\0';
    csc.b2 = '\0';
    csc.b3 = '\0';
    csc.cpStart = 0;
    csc.limit = srcLength;
    if (caseLocale == 2) {
      puVar6 = icu_63::LatinCase::TO_UPPER_TR;
    }
    else {
      puVar6 = icu_63::LatinCase::TO_UPPER_NORMAL;
    }
    uVar12 = 0;
    csc.p = src;
    pUVar7 = ucase_getTrie_63();
    local_a0 = 0;
    destIndex = 0;
    do {
      if ((int)uVar12 < srcLength) {
        do {
          UVar1 = src[(int)uVar12];
          uVar8 = (ulong)(ushort)UVar1;
          uVar5 = local_a0;
          if ((ushort)UVar1 < 0x17f) {
            cVar14 = puVar6[uVar8];
            if ((int)cVar14 == 0xffffff80) {
              bVar3 = false;
              cVar14 = '\x05';
            }
            else {
              uVar12 = uVar12 + 1;
              bVar13 = cVar14 == '\0';
              bVar3 = !bVar13;
              uVar10 = uVar10 & 0xffffffff;
              if (!bVar13) {
                uVar10 = (ulong)(uint)(int)cVar14;
              }
              cVar14 = bVar13 << 2;
            }
LAB_002f30ee:
            if (bVar3) {
              iVar11 = ~local_a0 + uVar12;
              uVar5 = destIndex;
              if (0 < iVar11) {
                if (edits != (Edits *)0x0) {
                  icu_63::Edits::addUnchanged(edits,iVar11);
                }
                if ((((options >> 0xe & 1) == 0) &&
                    (uVar5 = 0xffffffff, iVar11 <= (int)(destIndex ^ 0x7fffffff))) &&
                   (uVar5 = iVar11 + destIndex, (int)uVar5 <= destCapacity)) {
                  u_memcpy_63(dest + (int)destIndex,src + (int)local_a0,iVar11);
                }
              }
              destIndex = uVar5;
              uVar5 = (uint)(ushort)UVar1 + (int)uVar10;
              uVar8 = (ulong)uVar5;
              if (-1 < (int)destIndex) {
                if ((int)destIndex < destCapacity) {
                  dest[destIndex] = (UChar)uVar5;
LAB_002f31b6:
                  uVar5 = destIndex + 1;
                }
                else {
                  uVar5 = 0xffffffff;
                  if (destIndex != 0x7fffffff) goto LAB_002f31b6;
                }
                destIndex = uVar5;
                if (edits != (Edits *)0x0) {
                  icu_63::Edits::addReplace(edits,1,1);
                }
              }
              cVar14 = '\0';
              uVar5 = uVar12;
              if ((int)destIndex < 0) {
                *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                cVar14 = '\x01';
                uVar5 = local_a0;
              }
            }
          }
          else {
            cVar14 = '\x05';
            if ((ushort)UVar1 < 0xd800) {
              uVar2 = pUVar7->index
                      [((ushort)UVar1 & 0x1f) + (uint)pUVar7->index[(ushort)UVar1 >> 5] * 4];
              if ((uVar2 & 8) == 0) {
                uVar12 = uVar12 + 1;
                cVar14 = '\x04';
                bVar3 = false;
                if ((uVar2 & 3) == 1) {
                  if (uVar2 < 0x80) {
                    uVar10 = 0;
                  }
                  else {
                    uVar10 = (ulong)((uint)(int)(short)uVar2 >> 7 & 0xffff);
                    cVar14 = '\0';
                    bVar3 = true;
                  }
                }
              }
              else {
                bVar3 = false;
              }
              goto LAB_002f30ee;
            }
          }
          local_a0 = uVar5;
          if ((cVar14 != '\0') && (cVar14 != '\x04')) {
            uVar4 = local_a0;
            if (cVar14 != '\x05') goto LAB_002f33ab;
            break;
          }
        } while ((int)uVar12 < srcLength);
        uVar9 = (uint)uVar8 & 0xffff;
        uVar5 = uVar12;
      }
      else {
        uVar9 = 0;
        uVar5 = uVar12;
      }
      cVar14 = '\x02';
      uVar12 = uVar5;
      uVar4 = local_a0;
      if ((int)uVar5 < srcLength) {
        uVar12 = uVar5 + 1;
        csc.cpStart = uVar5;
        if ((((uVar9 & 0xfc00) == 0xd800) && ((int)uVar12 < srcLength)) &&
           (((ushort)src[(int)uVar12] & 0xfc00) == 0xdc00)) {
          uVar9 = uVar9 * 0x400 + (uint)(ushort)src[(int)uVar12] + 0xfca02400;
          uVar12 = uVar5 + 2;
        }
        csc.cpLimit = uVar12;
        result = ucase_toFullUpper_63
                           (uVar9,icu_63::anon_unknown_10::utf16_caseContextIterator,&csc,&local_60,
                            caseLocale);
        cVar14 = '\0';
        if (-1 < result) {
          iVar11 = uVar5 - local_a0;
          uVar9 = destIndex;
          if (iVar11 != 0 && (int)local_a0 <= (int)uVar5) {
            if (edits != (Edits *)0x0) {
              icu_63::Edits::addUnchanged(edits,iVar11);
            }
            if ((((options >> 0xe & 1) == 0) &&
                (uVar9 = 0xffffffff, iVar11 <= (int)(destIndex ^ 0x7fffffff))) &&
               (uVar9 = iVar11 + destIndex, (int)uVar9 <= destCapacity)) {
              u_memcpy_63(dest + (int)destIndex,src + (int)local_a0,iVar11);
            }
          }
          destIndex = uVar9;
          if (-1 < (int)destIndex) {
            destIndex = icu_63::anon_unknown_10::appendResult
                                  (dest,destIndex,destCapacity,result,local_60,uVar12 - uVar5,
                                   options,edits);
          }
          cVar14 = (int)destIndex < 0;
          uVar4 = uVar12;
          if ((bool)cVar14) {
            *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            uVar4 = local_a0;
          }
        }
      }
LAB_002f33ab:
      local_a0 = uVar4;
    } while (cVar14 == '\0');
    if (cVar14 == '\x02') {
      iVar11 = uVar12 - local_a0;
      uVar5 = destIndex;
      if (iVar11 != 0 && (int)local_a0 <= (int)uVar12) {
        if (edits != (Edits *)0x0) {
          icu_63::Edits::addUnchanged(edits,iVar11);
        }
        if ((((options >> 0xe & 1) == 0) &&
            (uVar5 = 0xffffffff, iVar11 <= (int)(destIndex ^ 0x7fffffff))) &&
           (uVar5 = iVar11 + destIndex, (int)uVar5 <= destCapacity)) {
          u_memcpy_63(dest + (int)destIndex,src + (int)local_a0,iVar11);
        }
      }
      if ((int)uVar5 < 0) {
        *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        uVar5 = 0;
      }
    }
    else {
      uVar5 = 0;
    }
  }
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (destCapacity < (int)uVar5) {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
    }
    else if (edits != (Edits *)0x0) {
      icu_63::Edits::copyErrorTo(edits,errorCode);
    }
  }
  return uVar5;
}

Assistant:

U_CFUNC int32_t U_CALLCONV
ustrcase_internalToUpper(int32_t caseLocale, uint32_t options, UCASEMAP_BREAK_ITERATOR_UNUSED
                         UChar *dest, int32_t destCapacity,
                         const UChar *src, int32_t srcLength,
                         icu::Edits *edits,
                         UErrorCode &errorCode) {
    int32_t destIndex;
    if (caseLocale == UCASE_LOC_GREEK) {
        destIndex = GreekUpper::toUpper(options, dest, destCapacity,
                                        src, srcLength, edits, errorCode);
    } else {
        UCaseContext csc=UCASECONTEXT_INITIALIZER;
        csc.p=(void *)src;
        csc.limit=srcLength;
        destIndex = toUpper(
            caseLocale, options,
            dest, destCapacity,
            src, &csc, srcLength,
            edits, errorCode);
    }
    return checkOverflowAndEditsError(destIndex, destCapacity, edits, errorCode);
}